

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_llist.c
# Opt level: O2

void ares_llist_node_detach(ares_llist_node_t *node)

{
  ares_llist_t *paVar1;
  ares_llist_node_t *paVar2;
  ares_llist_node_t *paVar3;
  
  paVar1 = node->parent;
  paVar2 = node->prev;
  paVar3 = node->next;
  if (paVar2 != (ares_llist_node_t *)0x0) {
    paVar2->next = paVar3;
  }
  if (paVar3 != (ares_llist_node_t *)0x0) {
    paVar3->prev = paVar2;
  }
  if (paVar1->head == node) {
    paVar1->head = paVar3;
  }
  if (paVar1->tail == node) {
    paVar1->tail = node->prev;
  }
  node->parent = (ares_llist_t *)0x0;
  paVar1->cnt = paVar1->cnt - 1;
  return;
}

Assistant:

static void ares_llist_node_detach(ares_llist_node_t *node)
{
  ares_llist_t *list;

  if (node == NULL) {
    return; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  list = node->parent;

  if (node->prev) {
    node->prev->next = node->next;
  }

  if (node->next) {
    node->next->prev = node->prev;
  }

  if (node == list->head) {
    list->head = node->next;
  }

  if (node == list->tail) {
    list->tail = node->prev;
  }

  node->parent = NULL;
  list->cnt--;
}